

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O2

void arssort(string *strings,size_t scnt)

{
  byte bVar1;
  int pos;
  int iVar2;
  stack *psVar3;
  list head;
  long lVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  stack *temp;
  list plVar10;
  bucket_conflict1 *b;
  ulong uVar11;
  list plVar12;
  uint uVar13;
  list plVar14;
  list local_860;
  uint local_838 [256];
  character chmin;
  
  head = (list)calloc(scnt,0x18);
  plVar14 = head;
  for (uVar8 = 0; scnt != uVar8; uVar8 = uVar8 + 1) {
    plVar12 = (list)0x0;
    if (uVar8 < scnt - 1) {
      plVar12 = plVar14 + 1;
    }
    plVar14->str = strings[uVar8];
    plVar14->next = plVar12;
    plVar14 = plVar14 + 1;
  }
  local_860 = head;
  if (1 < (int)scnt) {
    initmem(stackmem,0x18,(int)((scnt & 0xffffffff) / 0x32));
    push(head,(list)0x0,(int)scnt,0);
    local_860 = (list)0x0;
    while (psVar3 = stackp, stackp != (stack *)0x0) {
      stackp = (stack *)deallocmem(stackmem,0x18);
      if (psVar3->size == 0) {
        psVar3->tail->next = local_860;
        local_860 = psVar3->head;
      }
      else {
        plVar14 = psVar3->head;
        pos = psVar3->pos;
        if (psVar3->size < 0x5dd) {
          local_838[0] = 0;
          chmin = 0xff;
          uVar8 = (ulong)plVar14->str[pos];
          iVar2 = 1;
          plVar12 = plVar14;
          while( true ) {
            iVar6 = iVar2;
            plVar10 = plVar14;
            plVar14 = plVar10->next;
            uVar13 = (uint)uVar8;
            if (plVar14 == (list)0x0) break;
            bVar1 = plVar14->str[pos];
            iVar2 = iVar6 + 1;
            if (uVar13 != bVar1) {
              intobucket1((bucket_conflict1 *)(&onebyte_b + uVar8 * 3),plVar12,plVar10,iVar6,uVar13,
                          &chmin,(character *)local_838);
              uVar8 = (ulong)(uint)bVar1;
              iVar2 = 1;
              plVar12 = plVar14;
            }
          }
          intobucket1((bucket_conflict1 *)(&onebyte_b + uVar8 * 3),plVar12,plVar10,iVar6,uVar13,
                      &chmin,(character *)local_838);
          if (onebyte_b != 0) {
            _DAT_00c7b7a0 = 0;
            ontostack((bucket_conflict1 *)&onebyte_b,pos);
          }
          lVar4 = (long)(int)local_838[0];
          for (b = (bucket_conflict1 *)(&onebyte_b + (long)chmin * 3);
              b <= (bucket_conflict1 *)(&onebyte_b + lVar4 * 3); b = b + 1) {
            if (b->head != (list)0x0) {
              ontostack(b,pos + 1);
            }
          }
        }
        else {
          for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
            local_838[lVar4] = 0;
            (&chmin)[lVar4] = 0;
          }
          bVar1 = plVar14->str[pos];
          if (bVar1 == 0) {
            uVar13 = 0;
          }
          else {
            uVar13 = (uint)plVar14->str[(long)pos + 1];
          }
          uVar13 = (uint)bVar1 << 8 | uVar13;
LAB_002231b0:
          plVar12 = plVar14;
          iVar2 = 1;
          while( true ) {
            iVar6 = iVar2;
            plVar10 = plVar12;
            plVar12 = plVar10->next;
            if (plVar12 == (list)0x0) break;
            bVar1 = plVar12->str[pos];
            if (bVar1 == 0) {
              uVar9 = 0;
            }
            else {
              uVar9 = (uint)plVar12->str[(long)pos + 1];
            }
            uVar9 = (uint)bVar1 << 8 | uVar9;
            iVar2 = iVar6 + 1;
            if (uVar9 != uVar13) goto code_r0x002231e4;
          }
          intobucket2((bucket_conflict1 *)(&twobytes_b + (ulong)uVar13 * 3),plVar14,plVar10,iVar6,
                      uVar13,&chmin,(int *)local_838);
          uVar9 = 0;
          uVar13 = 0;
          for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
            if ((&chmin)[lVar4] != 0) {
              lVar7 = (long)(int)uVar9;
              uVar9 = uVar9 + 1;
              (&chmin)[lVar7] = (uint)lVar4;
            }
            if (local_838[lVar4] != 0) {
              lVar7 = (long)(int)uVar13;
              uVar13 = uVar13 + 1;
              local_838[lVar7] = (uint)lVar4;
            }
          }
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
            iVar2 = (&chmin)[uVar8];
            for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
              lVar4 = (long)(int)(local_838[uVar11] | iVar2 << 8);
              if ((&twobytes_b)[lVar4 * 3] != 0) {
                if ((char)local_838[uVar11] == '\0') {
                  *(undefined4 *)(&DAT_00c7cfa0 + lVar4 * 0x18) = 0;
                }
                ontostack((bucket_conflict1 *)(&twobytes_b + lVar4 * 3),pos + 2);
              }
            }
          }
        }
      }
    }
    freemem(stackmem);
  }
  for (sVar5 = 0; scnt != sVar5; sVar5 = sVar5 + 1) {
    strings[sVar5] = local_860->str;
    local_860 = local_860->next;
  }
  free(head);
  return;
code_r0x002231e4:
  intobucket2((bucket_conflict1 *)(&twobytes_b + (ulong)uVar13 * 3),plVar14,plVar10,iVar6,uVar13,
              &chmin,(int *)local_838);
  plVar14 = plVar12;
  uVar13 = uVar9;
  goto LAB_002231b0;
}

Assistant:

void arssort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   int i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1]; 
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = MSD(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}